

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_matrix_z2_chain_vine.cpp
# Opt level: O1

void __thiscall
Chain_matrix_z2_vine_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_false,_true>_>_>
::test_method(Chain_matrix_z2_vine_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_false,_true>_>_>
              *this)

{
  _Hash_node_base *p_Var1;
  Column_settings *pCVar2;
  Column_settings *pCVar3;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columns;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_false,_true>_>
  m;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  vStack_1e8;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_false,_true>_>
  local_1d0;
  
  build_longer_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true,false,true>>>>
            ();
  local_1d0.colSettings_ = (Column_settings *)operator_new(0x38);
  (((Entry_constructor *)
   &((pool<boost::default_user_allocator_malloc_free> *)local_1d0.colSettings_)->
    super_simple_segregated_storage<unsigned_long>)->entryPool_).
  super_pool<boost::default_user_allocator_malloc_free>.
  super_simple_segregated_storage<unsigned_long>.first = (void *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_1d0.colSettings_)->list).ptr =
       (char *)0x0;
  (((pool<boost::default_user_allocator_malloc_free> *)local_1d0.colSettings_)->list).sz = 0;
  ((pool<boost::default_user_allocator_malloc_free> *)local_1d0.colSettings_)->requested_size = 0x30
  ;
  ((pool<boost::default_user_allocator_malloc_free> *)local_1d0.colSettings_)->next_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_1d0.colSettings_)->start_size = 0x20;
  ((pool<boost::default_user_allocator_malloc_free> *)local_1d0.colSettings_)->max_size = 0;
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true,false,true>>>
  ::Chain_matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true,false,true>>>
              *)&local_1d0.matrix_,&vStack_1e8,local_1d0.colSettings_);
  test_representative_cycles<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,true,true,true,true,true,false,true>>>
            (&local_1d0);
  pCVar2 = local_1d0.colSettings_;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_false,_true>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_false,_true>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&local_1d0.matrix_.matrix_._M_h);
  while (local_1d0.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0
        ) {
    p_Var1 = (local_1d0.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt)->_M_nxt;
    operator_delete(local_1d0.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt,0x10);
    local_1d0.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = p_Var1;
  }
  memset(local_1d0.matrix_.pivotToColumnIndex_._M_h._M_buckets,0,
         local_1d0.matrix_.pivotToColumnIndex_._M_h._M_bucket_count << 3);
  pCVar3 = local_1d0.colSettings_;
  local_1d0.matrix_.pivotToColumnIndex_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1d0.matrix_.pivotToColumnIndex_._M_h._M_element_count = 0;
  local_1d0.matrix_.nextIndex_ = 0;
  local_1d0.matrix_.colSettings_ = pCVar2;
  if ((pool<boost::default_user_allocator_malloc_free> *)local_1d0.colSettings_ !=
      (pool<boost::default_user_allocator_malloc_free> *)0x0) {
    boost::pool<boost::default_user_allocator_malloc_free>::purge_memory
              ((pool<boost::default_user_allocator_malloc_free> *)local_1d0.colSettings_);
    operator_delete(pCVar3,0x38);
  }
  Gudhi::persistence_matrix::
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_true,_true,_true,_true,_true,_false,_true>_>_>
  ::~Chain_matrix(&local_1d0.matrix_);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&vStack_1e8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Chain_matrix_z2_vine_representative_cycles, Matrix, rep_matrices) {
  auto columns = build_longer_boundary_matrix<typename Matrix::Column>();
  Matrix m(columns);
  test_representative_cycles<Matrix>(m);
}